

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O3

qsizetype indexOf<QLatin1StringView>
                    (QExplicitlySharedDataPointer<QCborContainerPrivate> *o,QLatin1StringView key,
                    bool *keyExists)

{
  QCborContainerPrivate *pQVar1;
  anon_union_8_2_4ee71171_for_Element_0 *paVar2;
  ulong uVar3;
  anon_union_8_2_4ee71171_for_Element_0 *paVar4;
  int iVar5;
  difference_type __d;
  ulong uVar6;
  ulong uVar7;
  anon_union_8_2_4ee71171_for_Element_0 *e;
  long in_FS_OFFSET;
  bool bVar8;
  anon_union_8_2_4ee71171_for_Element_0 local_48;
  anon_union_8_2_4ee71171_for_Element_0 aStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (o->d).ptr;
  paVar2 = &((pQVar1->elements).d.ptr)->field_0;
  uVar3 = (pQVar1->elements).d.size;
  e = paVar2;
  if (1 < (long)uVar3) {
    uVar7 = uVar3 >> 1;
    do {
      uVar6 = uVar7 >> 1;
      paVar4 = e + uVar6 * 4;
      local_48 = *paVar4;
      aStack_40 = paVar4[1];
      iVar5 = QCborContainerPrivate::stringCompareElement<QLatin1StringView>
                        ((o->d).ptr,(Element *)&local_48,key,ForOrdering);
      uVar7 = ~uVar6 + uVar7;
      paVar4 = paVar4 + 4;
      if (-1 < iVar5) {
        uVar7 = uVar6;
        paVar4 = e;
      }
      e = paVar4;
    } while (0 < (long)uVar7);
  }
  if (e == paVar2 + uVar3 * 2) {
    bVar8 = false;
  }
  else {
    iVar5 = QCborContainerPrivate::stringCompareElement<QLatin1StringView>
                      ((o->d).ptr,(Element *)e,key,ForEquality);
    bVar8 = iVar5 == 0;
  }
  *keyExists = bVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (long)e - (long)paVar2 >> 4;
  }
  __stack_chk_fail();
}

Assistant:

static qsizetype indexOf(const QExplicitlySharedDataPointer<QCborContainerPrivate> &o,
                         String key, bool *keyExists)
{
    const auto begin = QJsonPrivate::ConstKeyIterator(o->elements.constBegin());
    const auto end = QJsonPrivate::ConstKeyIterator(o->elements.constEnd());

    const auto it = std::lower_bound(
                begin, end, key,
                [&](const QJsonPrivate::ConstKeyIterator::value_type &e, const String &key) {
        return o->stringCompareElement(e.key(), key, QtCbor::Comparison::ForOrdering) < 0;
    });

    *keyExists = (it != end) && o->stringEqualsElement((*it).key(), key);
    return it.it - begin.it;
}